

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void operator_delete(void *p,size_t size)

{
  if (base::internal::delete_hooks_ != 0) {
    tcmalloc::InvokeDeleteHookSlow(p);
  }
  DebugDeallocate(p,-0x145237f,size);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete_sized(void* p, size_t size) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, size);
  force_frame();
}